

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warn.cc
# Opt level: O3

void __thiscall
re2c::Warn::unreachable_rule(Warn *this,string *cond,rule_info_t *rule,rules_t *rules)

{
  FILE *__stream;
  uint uVar1;
  bool error;
  string local_50;
  
  if ((this->mask[5] & 1) != 0) {
    uVar1 = this->mask[5] & 2;
    error = SUB41(uVar1 >> 1,0);
    this->error_accuml = (bool)(this->error_accuml | error);
    warning_start(rule->line,error);
    __stream = _stderr;
    incond(&local_50,cond);
    fprintf(__stream,"unreachable rule %s",local_50._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((rule->shadow)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      unreachable_rule();
    }
    warning_end(PTR_anon_var_dwarf_6dce6_0015c2d8,uVar1 != 0);
  }
  return;
}

Assistant:

void Warn::unreachable_rule (const std::string & cond, const rule_info_t & rule, const rules_t & rules)
{
	if (mask[UNREACHABLE_RULES] & WARNING)
	{
		const bool e = mask[UNREACHABLE_RULES] & ERROR;
		error_accuml |= e;
		warning_start (rule.line, e);
		fprintf (stderr, "unreachable rule %s", incond (cond).c_str ());
		const size_t shadows = rule.shadow.size ();
		if (shadows > 0)
		{
			const char * pl = shadows > 1
				? "s"
				: "";
			std::set<rule_rank_t>::const_iterator i = rule.shadow.begin ();
			fprintf (stderr, "(shadowed by rule%s at line%s %u", pl, pl, rules.find (*i)->second.line);
			for (++i; i != rule.shadow.end (); ++i)
			{
				fprintf (stderr, ", %u", rules.find (*i)->second.line);
			}
			fprintf (stderr, ")");
		}
		warning_end (names[UNREACHABLE_RULES], e);
	}
}